

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

string * __thiscall
t_netstd_generator::make_csharp_string_literal
          (string *__return_storage_ptr__,t_netstd_generator *this,string *value)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  _func_int *p_Var4;
  size_type sVar5;
  stringstream result;
  char local_1c1;
  string *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [24];
  undefined1 auStack_190 [88];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  if (value->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
    sVar2 = value->_M_string_length;
    local_1c0 = __return_storage_ptr__;
    if (sVar2 != 0) {
      pcVar3 = (value->_M_dataplus)._M_p;
      sVar5 = 0;
      do {
        cVar1 = pcVar3[sVar5];
        if ((uint)(int)cVar1 < 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\x",2);
          *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
               *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) &
               0xffffffb5 | 8;
          *(undefined8 *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = 4;
          p_Var4 = *(_func_int **)(local_1a8._0_8_ + -0x18);
          if ((acStack_c8 + 1)[(long)p_Var4] == '\0') {
            std::ios::widen((char)(ostream *)local_1a8 + (char)p_Var4);
            (acStack_c8 + 1)[(long)p_Var4] = '\x01';
          }
          acStack_c8[(long)p_Var4] = '0';
          std::ostream::operator<<((ostream *)local_1a8,(int)cVar1);
        }
        else if ((cVar1 == '\\') || (cVar1 == '\"')) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\",1);
          local_1c1 = cVar1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1c1,1);
        }
        else {
          local_1c1 = cVar1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1c1,1);
        }
        sVar5 = sVar5 + 1;
      } while (sVar2 != sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
    __return_storage_ptr__ = local_1c0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::make_csharp_string_literal( string const& value)
{
  if (value.length() == 0) {
    return "";
  }

  std::stringstream result;
  result << "\"";
  for (signed char const c: value) {
    if( (c >= 0) && (c < 32)) {  // convert ctrl chars, but leave UTF-8 alone
      int width = std::max( (int)sizeof(c), 4);
      result << "\\x" << std::hex << std::setw(width) << std::setfill('0') << (int)c;
    } else if ((c == '\\') || (c == '"')) {
      result << "\\" << c;
    } else {
      result << c;   // anything else "as is"
    }
  }
  result << "\"";

  return result.str();
}